

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O0

duckdb_state
duckdb_bind_parameter_index
          (duckdb_prepared_statement prepared_statement,idx_t *param_idx_out,char *name_p)

{
  bool bVar1;
  pointer pPVar2;
  reference ppVar3;
  string *in_RDX;
  unsigned_long *in_RSI;
  long in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *pair;
  iterator __end1;
  iterator __begin1;
  case_insensitive_map_t<idx_t> *__range1;
  string name;
  PreparedStatementWrapper *wrapper;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
  *in_stack_ffffffffffffff60;
  string *l2;
  string *l1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_78;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_70;
  case_insensitive_map_t<idx_t> *local_68;
  undefined1 local_49 [41];
  string *local_20;
  unsigned_long *local_18;
  duckdb_state local_4;
  
  if ((in_RDI != 0) &&
     (local_20 = in_RDX, local_18 = in_RSI,
     bVar1 = std::unique_ptr::operator_cast_to_bool
                       ((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                         *)0x1915abb), bVar1)) {
    pPVar2 = duckdb::
             unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
             ::operator->(in_stack_ffffffffffffff60);
    bVar1 = duckdb::PreparedStatement::HasError(pPVar2);
    if (!bVar1) {
      if ((local_20 == (string *)0x0) || (local_18 == (unsigned_long *)0x0)) {
        return DuckDBError;
      }
      l1 = (string *)local_49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_49 + 1),(char *)local_20,(allocator *)l1);
      std::allocator<char>::~allocator((allocator<char> *)local_49);
      pPVar2 = duckdb::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               ::operator->(in_stack_ffffffffffffff60);
      local_68 = &pPVar2->named_param_map;
      local_70._M_cur =
           (__node_type *)
           duckdb::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      local_78._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      l2 = local_20;
      do {
        bVar1 = std::__detail::operator!=
                          ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                            *)&local_70,&local_78);
        if (!bVar1) {
          local_4 = DuckDBError;
LAB_01915c5f:
          std::__cxx11::string::~string((string *)(local_49 + 1));
          return local_4;
        }
        ppVar3 = duckdb::std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                 ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                              *)0x1915bba);
        bVar1 = duckdb::StringUtil::CIEquals(l1,l2);
        if (bVar1) {
          *local_18 = ppVar3->second;
          local_4 = DuckDBSuccess;
          goto LAB_01915c5f;
        }
        duckdb::std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
        ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                      *)pPVar2);
      } while( true );
    }
  }
  return DuckDBError;
}

Assistant:

duckdb_state duckdb_bind_parameter_index(duckdb_prepared_statement prepared_statement, idx_t *param_idx_out,
                                         const char *name_p) {
	auto wrapper = (PreparedStatementWrapper *)prepared_statement;
	if (!wrapper || !wrapper->statement || wrapper->statement->HasError()) {
		return DuckDBError;
	}
	if (!name_p || !param_idx_out) {
		return DuckDBError;
	}
	auto name = std::string(name_p);
	for (auto &pair : wrapper->statement->named_param_map) {
		if (duckdb::StringUtil::CIEquals(pair.first, name)) {
			*param_idx_out = pair.second;
			return DuckDBSuccess;
		}
	}
	return DuckDBError;
}